

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderInvarianceRule4Test::initTestIterations
          (TessellationShaderInvarianceRule4Test *this)

{
  pointer *pp_Var1;
  _tessellation_primitive_mode primitive_mode;
  _tessellation_shader_vertex_spacing _Var2;
  iterator __position;
  bool bVar3;
  GLfloat aGVar4 [2];
  bool bVar5;
  int iVar6;
  deUint32 err;
  undefined4 extraout_var;
  long lVar7;
  _tessellation_levels *current_levels;
  GLfloat aGVar8 [2];
  GLint gl_max_tess_gen_level_value;
  _test_iteration test;
  undefined1 local_78 [12];
  float fStack_6c;
  undefined8 local_68;
  _tessellation_primitive_mode _Stack_60;
  _tessellation_shader_vertex_spacing _Stack_5c;
  uint local_58;
  pointer local_50;
  GLfloat local_48 [2];
  long local_40;
  vector<glcts::TessellationShaderInvarianceRule4Test::_test_iteration,std::allocator<glcts::TessellationShaderInvarianceRule4Test::_test_iteration>>
  *local_38;
  
  iVar6 = (*((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar6) + 0x868))
            ((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.m_glExtTokens.
             MAX_TESS_GEN_LEVEL);
  err = (**(code **)(CONCAT44(extraout_var,iVar6) + 0x800))();
  glu::checkError(err,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x68f);
  local_38 = (vector<glcts::TessellationShaderInvarianceRule4Test::_test_iteration,std::allocator<glcts::TessellationShaderInvarianceRule4Test::_test_iteration>>
              *)&this->m_test_iterations;
  lVar7 = 0;
  bVar5 = true;
  do {
    bVar3 = bVar5;
    primitive_mode = (&DAT_01b5b304)[lVar7];
    local_40 = 0;
    do {
      _Var2 = (&DAT_01b5b144)[local_40];
      TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
                ((_tessellation_levels_set *)local_78,primitive_mode,0,
                 TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);
      aGVar4 = stack0xffffffffffffff90;
      local_50 = local_68;
      local_48 = (GLfloat  [2])local_78._0_8_;
      for (aGVar8 = (GLfloat  [2])local_78._0_8_; aGVar8 != aGVar4;
          aGVar8 = (GLfloat  [2])((long)aGVar8 + 0x18)) {
        local_58 = 0;
        local_78._0_8_ = *(undefined8 *)aGVar8;
        fStack_6c = *(float *)((long)aGVar8 + 8);
        local_78._8_4_ = fStack_6c;
        local_68 = (pointer)CONCAT44(fStack_6c,fStack_6c);
        _Stack_5c = _Var2;
        _Stack_60 = primitive_mode;
        __position._M_current =
             (this->m_test_iterations).
             super__Vector_base<glcts::TessellationShaderInvarianceRule4Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule4Test::_test_iteration>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_test_iterations).
            super__Vector_base<glcts::TessellationShaderInvarianceRule4Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule4Test::_test_iteration>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<glcts::TessellationShaderInvarianceRule4Test::_test_iteration,std::allocator<glcts::TessellationShaderInvarianceRule4Test::_test_iteration>>
          ::_M_realloc_insert<glcts::TessellationShaderInvarianceRule4Test::_test_iteration_const&>
                    (local_38,__position,(_test_iteration *)local_78);
        }
        else {
          (__position._M_current)->n_vertices = 0;
          *(pointer *)((__position._M_current)->outer_tess_levels + 2) = local_68;
          (__position._M_current)->primitive_mode = primitive_mode;
          (__position._M_current)->vertex_spacing = _Var2;
          *(undefined8 *)(__position._M_current)->inner_tess_levels = local_78._0_8_;
          *(GLfloat (*) [2])(__position._M_current)->outer_tess_levels = stack0xffffffffffffff90;
          pp_Var1 = &(this->m_test_iterations).
                     super__Vector_base<glcts::TessellationShaderInvarianceRule4Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule4Test::_test_iteration>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pp_Var1 = *pp_Var1 + 1;
        }
      }
      if (local_48 != (GLfloat  [2])0x0) {
        operator_delete((void *)local_48,(long)local_50 - (long)local_48);
      }
      local_40 = local_40 + 1;
    } while (local_40 != 3);
    lVar7 = 1;
    bVar5 = false;
  } while (bVar3);
  return;
}

Assistant:

void TessellationShaderInvarianceRule4Test::initTestIterations()
{
	DE_ASSERT(m_test_iterations.size() == 0);

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	const glw::Functions& gl						  = m_context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Iterate through all primitive and vertex spacing modes relevant to the test */
	_tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
													   TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES };
	_tessellation_shader_vertex_spacing vs_modes[] = { TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
													   TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN,
													   TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD };

	const unsigned int n_primitive_modes = sizeof(primitive_modes) / sizeof(primitive_modes[0]);
	const unsigned int n_vs_modes		 = sizeof(vs_modes) / sizeof(vs_modes[0]);

	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		_tessellation_primitive_mode primitive_mode = primitive_modes[n_primitive_mode];

		for (unsigned int n_vs_mode = 0; n_vs_mode < n_vs_modes; ++n_vs_mode)
		{
			_tessellation_shader_vertex_spacing vs_mode = vs_modes[n_vs_mode];

			/* Retrieve inner/outer tessellation level combinations we want the tests to be run for */
			_tessellation_levels_set levels;

			levels = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
				primitive_mode, gl_max_tess_gen_level_value,
				TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);

			/* Iterate through all configurations */
			for (_tessellation_levels_set_const_iterator levels_iterator = levels.begin();
				 levels_iterator != levels.end(); levels_iterator++)
			{
				const _tessellation_levels& current_levels = *levels_iterator;

				/* Create a test descriptor for all the parameters we now have.
				 *
				 * The set we're operating on uses different outer tessellation level values, so we
				 * need to make sure the levels are set to the same FP values in order for the test
				 * to succeed. */
				_test_iteration test;

				memcpy(test.inner_tess_levels, current_levels.inner, sizeof(test.inner_tess_levels));

				for (int n = 0; n < 4 /* outer tess levels */; ++n)
				{
					test.outer_tess_levels[n] = current_levels.outer[0];
				}

				test.primitive_mode = primitive_mode;
				test.vertex_spacing = vs_mode;

				m_test_iterations.push_back(test);
			} /* for (all inner/outer tessellation levels) */
		}	 /* for (all vertex spacing modes) */
	}		  /* for (all primitive modes) */
}